

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_ml_basic_string<toml::type_config>
          (location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  size_type sVar2;
  reference pcVar3;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  esc;
  location loc2;
  const_iterator iter;
  string_type val;
  string str;
  region reg;
  string_format_info fmt;
  spec *spec;
  location first;
  context<toml::type_config> *in_stack_00000810;
  location *in_stack_00000818;
  undefined7 in_stack_fffffffffffff8b8;
  char in_stack_fffffffffffff8bf;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  location *in_stack_fffffffffffff8d8;
  error_type *in_stack_fffffffffffff8e0;
  allocator<char> *in_stack_fffffffffffff8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff900;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff908;
  region *in_stack_fffffffffffff918;
  source_location in_stack_fffffffffffff920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff928;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *this_00;
  string_format_info in_stack_fffffffffffff946;
  string *in_stack_fffffffffffff968;
  spec *in_stack_fffffffffffff998;
  basic_value<toml::type_config> *v;
  location *in_stack_fffffffffffff9b0;
  sequence *in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffffa48;
  string *in_stack_fffffffffffffb10;
  location *in_stack_fffffffffffffb18;
  sequence *in_stack_fffffffffffffb20;
  string *in_stack_fffffffffffffb28;
  result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
  local_420 [2];
  char *local_338;
  char *local_330;
  location local_308;
  char *local_2c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  uint local_270;
  allocator<char> local_269 [144];
  allocator<char> local_1d9 [121];
  error_info local_160 [2];
  string_format_info local_6a;
  spec *local_68;
  context<toml::type_config> *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  location::location((location *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  string_format_info::string_format_info(&local_6a);
  local_6a.fmt = multiline_basic;
  syntax::ml_basic_string((spec *)in_stack_fffffffffffffa48);
  sequence::scan(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  sequence::~sequence((sequence *)in_stack_fffffffffffff8c0);
  bVar1 = region::is_ok((region *)0x6f957e);
  if (bVar1) {
    region::as_string_abi_cxx11_(in_stack_fffffffffffff918);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8,
               (size_type)in_stack_fffffffffffff8c0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              (&local_290);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8,
               (size_type)in_stack_fffffffffffff8c0);
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(&local_290);
    if ((sVar2 == 0) ||
       (in_stack_fffffffffffff908._M_current =
             std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8),
       *in_stack_fffffffffffff908._M_current != '\n')) {
      sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(&local_290);
      if ((1 < sVar2) &&
         ((in_stack_fffffffffffff900._M_current =
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8),
          *(char *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff900._M_current)->_M_dataplus)._M_p == '\r' &&
          (in_stack_fffffffffffff8f8 =
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8),
          *(char *)&(in_stack_fffffffffffff8f8->_M_dataplus)._M_p == '\n')))) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8,
                   (size_type)in_stack_fffffffffffff8c0);
        local_6a.start_with_newline = true;
      }
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8,
                 (size_type)in_stack_fffffffffffff8c0);
      local_6a.start_with_newline = true;
    }
    std::__cxx11::string::string(in_stack_fffffffffffff8d0);
    local_2b8[0]._M_current =
         (char *)CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cbegin
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
    do {
      while( true ) {
        local_2c0 = (char *)CLI::std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cend
                                      (in_stack_fffffffffffff8c8);
        bVar1 = __gnu_cxx::
                operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffff8c0,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          in_stack_fffffffffffff8c0 =
               (result<toml::basic_value<toml::type_config>,_toml::error_info> *)
               &stack0xfffffffffffff9c8;
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff900._M_current,in_stack_fffffffffffff8f8);
          v = (basic_value<toml::type_config> *)0x0;
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x6f9d77);
          this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffff940;
          region::region((region *)in_stack_fffffffffffff8c0,
                         (region *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          basic_value<toml::type_config>::basic_value
                    ((basic_value<toml::type_config> *)this_00,(string_type *)in_RDI,
                     in_stack_fffffffffffff946,in_stack_fffffffffffff928,
                     (region_type *)in_stack_fffffffffffff920._M_impl);
          ok<toml::basic_value<toml::type_config>>(v);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_fffffffffffff8c0,
                     (success_type *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          success<toml::basic_value<toml::type_config>_>::~success
                    ((success<toml::basic_value<toml::type_config>_> *)0x6f9def);
          basic_value<toml::type_config>::~basic_value
                    ((basic_value<toml::type_config> *)in_stack_fffffffffffff8c0);
          region::~region((region *)in_stack_fffffffffffff8c0);
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8c0);
          local_270 = 1;
          goto LAB_006f9eb6;
        }
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_2b8);
        if (*pcVar3 == '\\') break;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_2b8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bf);
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_2b8);
      }
      local_330 = local_2b8[0]._M_current;
      local_338 = (char *)CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cend
                                    (in_stack_fffffffffffff8c8);
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                (in_stack_fffffffffffff908,in_stack_fffffffffffff900);
      make_temporary_location(in_stack_fffffffffffff968);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8c0);
      syntax::escaped_newline(in_stack_fffffffffffff998);
      sequence::scan(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
      bVar1 = region::is_ok((region *)0x6f9a9a);
      region::~region((region *)in_stack_fffffffffffff8c0);
      sequence::~sequence((sequence *)in_stack_fffffffffffff8c0);
      if (bVar1) {
        location::get_location(&local_308);
        std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff8e0,(unsigned_long)in_stack_fffffffffffff8d8);
LAB_006f9cb6:
        local_270 = 0;
      }
      else {
        parse_escape_sequence<toml::type_config>(in_stack_00000818,in_stack_00000810);
        bVar1 = result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                ::is_err(local_420);
        if (bVar1) {
          in_stack_fffffffffffff8e0 =
               result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               ::unwrap_err((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                             *)in_stack_fffffffffffff918,in_stack_fffffffffffff920);
          err<toml::error_info&>((error_info *)in_stack_fffffffffffff918);
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (in_stack_fffffffffffff8c0,
                     (failure_type *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6f9bd3);
        }
        else {
          in_stack_fffffffffffff8d8 =
               (location *)
               result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
               ::unwrap((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                         *)in_stack_fffffffffffff918,in_stack_fffffffffffff920);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
          location::get_location(&local_308);
          std::advance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,unsigned_long>
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff8e0,(unsigned_long)in_stack_fffffffffffff8d8);
        }
        local_270 = (uint)bVar1;
        result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
        ::~result((result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::error_info>
                   *)0x6f9c98);
        if (local_270 == 0) goto LAB_006f9cb6;
      }
      location::~location((location *)in_stack_fffffffffffff8c0);
    } while (local_270 == 0);
LAB_006f9eb6:
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff900._M_current,(char *)in_stack_fffffffffffff8f8,
               in_stack_fffffffffffff8f0);
    syntax::ml_basic_string((spec *)in_stack_fffffffffffffa48);
    location::location((location *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff900._M_current,(char *)in_stack_fffffffffffff8f8,
               in_stack_fffffffffffff8f0);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
               in_stack_fffffffffffffb10);
    err<toml::error_info>(local_160);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff8c0,
               (failure_type *)CONCAT17(in_stack_fffffffffffff8bf,in_stack_fffffffffffff8b8));
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x6f9675);
    error_info::~error_info((error_info *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c0);
    std::allocator<char>::~allocator(local_269);
    location::~location((location *)in_stack_fffffffffffff8c0);
    sequence::~sequence((sequence *)in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8c0);
    std::allocator<char>::~allocator(local_1d9);
    local_270 = 1;
  }
  region::~region((region *)in_stack_fffffffffffff8c0);
  location::~location((location *)in_stack_fffffffffffff8c0);
  return this_00;
}

Assistant:

result<basic_value<TC>, error_info>
parse_ml_basic_string(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    string_format_info fmt;
    fmt.fmt = string_format::multiline_basic;

    auto reg = syntax::ml_basic_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_ml_basic_string: "
            "invalid string format",
            syntax::ml_basic_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    // we already checked that it starts with """ and ends with """.
    assert(str.substr(0, 3) == "\"\"\"");
    str.erase(0, 3);

    assert(str.size() >= 3);
    assert(str.substr(str.size()-3, 3) == "\"\"\"");
    str.erase(str.size()-3, 3);

    // the first newline just after """ is trimmed
    if(str.size() >= 1 && str.at(0) == '\n')
    {
        str.erase(0, 1);
        fmt.start_with_newline = true;
    }
    else if(str.size() >= 2 && str.at(0) == '\r' && str.at(1) == '\n')
    {
        str.erase(0, 2);
        fmt.start_with_newline = true;
    }

    using string_type = typename basic_value<TC>::string_type;
    string_type val;
    {
        auto iter = str.cbegin();
        while(iter != str.cend())
        {
            if(*iter == '\\') // remove whitespaces around escaped-newline
            {
                // we assume that the string is not too long to copy
                auto loc2 = make_temporary_location(make_string(iter, str.cend()));
                if(syntax::escaped_newline(spec).scan(loc2).is_ok())
                {
                    std::advance(iter, loc2.get_location()); // skip escaped newline and indent
                    // now iter points non-WS char
                    assert(iter == str.end() || (*iter != ' ' && *iter != '\t'));
                }
                else // normal escape seq.
                {
                    auto esc = parse_escape_sequence(loc2, ctx);

                    // syntax does not check its value. the unicode codepoint may be
                    // invalid, e.g. out-of-bound, [0xD800, 0xDFFF]
                    if(esc.is_err())
                    {
                        return err(esc.unwrap_err());
                    }

                    val += esc.unwrap();
                    std::advance(iter, loc2.get_location());
                }
            }
            else // we already checked the syntax. we don't need to check it again.
            {
                val += static_cast<typename string_type::value_type>(*iter);
                ++iter;
            }
        }
    }

    return ok(basic_value<TC>(
            std::move(val), std::move(fmt), {}, std::move(reg)
        ));
}